

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O0

DWARFUnit * __thiscall llvm::DWARFUnitVector::getUnitForIndexEntry(DWARFUnitVector *this,Entry *E)

{
  DWARFSectionKind __args_1;
  bool bVar1;
  uint uVar2;
  SectionContribution *pSVar3;
  iterator puVar4;
  iterator puVar5;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *this_00;
  pointer pDVar6;
  uint64_t uVar7;
  DWARFUnit *NewCU;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> U;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *CU;
  iterator end;
  uint32_t Offset;
  SectionContribution *CUOff;
  Entry *E_local;
  DWARFUnitVector *this_local;
  
  pSVar3 = DWARFUnitIndex::Entry::getOffset(E,DW_SECT_INFO);
  if (pSVar3 == (SectionContribution *)0x0) {
    this_local = (DWARFUnitVector *)0x0;
  }
  else {
    __args_1 = pSVar3->Offset;
    puVar4 = SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             ::begin((SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                      *)this);
    uVar2 = getNumInfoUnits(this);
    puVar5 = SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
             ::begin((SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
                      *)this);
    this_00 = std::
              upper_bound<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*,unsigned_int,llvm::DWARFUnitVector::getUnitForIndexEntry(llvm::DWARFUnitIndex::Entry_const&)::__0>
                        (puVar5,puVar4 + uVar2,pSVar3);
    if (this_00 != puVar4 + uVar2) {
      pDVar6 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                         (this_00);
      uVar7 = DWARFUnit::getOffset(pDVar6);
      if (uVar7 <= __args_1) {
        pDVar6 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::get
                           (this_00);
        return pDVar6;
      }
    }
    bVar1 = std::function::operator_cast_to_bool((function *)&this->Parser);
    if (bVar1) {
      std::
      function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
      ::operator()((function<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_(unsigned_long,_llvm::DWARFSectionKind,_const_llvm::DWARFSection_*,_const_llvm::DWARFUnitIndex::Entry_*)>
                    *)&NewCU,(unsigned_long)&this->Parser,__args_1,(DWARFSection *)0x1,(Entry *)0x0)
      ;
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&NewCU);
      if (!bVar1) {
        std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator=
                  ((unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)&NewCU,
                   (nullptr_t)0x0);
      }
      this_local = (DWARFUnitVector *)
                   std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::get
                             ((unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                              &NewCU);
      SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>::
      insert((SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              *)this,this_00,
             (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)&NewCU);
      this->NumInfoUnits = this->NumInfoUnits + 1;
      std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::~unique_ptr
                ((unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)&NewCU);
    }
    else {
      this_local = (DWARFUnitVector *)0x0;
    }
  }
  return (DWARFUnit *)this_local;
}

Assistant:

DWARFUnit *
DWARFUnitVector::getUnitForIndexEntry(const DWARFUnitIndex::Entry &E) {
  const auto *CUOff = E.getOffset(DW_SECT_INFO);
  if (!CUOff)
    return nullptr;

  auto Offset = CUOff->Offset;
  auto end = begin() + getNumInfoUnits();

  auto *CU =
      std::upper_bound(begin(), end, CUOff->Offset,
                       [](uint64_t LHS, const std::unique_ptr<DWARFUnit> &RHS) {
                         return LHS < RHS->getNextUnitOffset();
                       });
  if (CU != end && (*CU)->getOffset() <= Offset)
    return CU->get();

  if (!Parser)
    return nullptr;

  auto U = Parser(Offset, DW_SECT_INFO, nullptr, &E);
  if (!U)
    U = nullptr;

  auto *NewCU = U.get();
  this->insert(CU, std::move(U));
  ++NumInfoUnits;
  return NewCU;
}